

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O1

int lls_normal(double *A,double *b,int M,int N,double *x)

{
  double *pdVar1;
  double *pdVar2;
  size_t __size;
  ulong uVar3;
  int iVar4;
  double *col;
  double *C;
  double *C_00;
  double *__ptr;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  
  lVar9 = (long)N;
  col = (double *)malloc(M * lVar9 * 8);
  __size = lVar9 * 8;
  C = (double *)malloc(__size);
  C_00 = (double *)malloc(__size * lVar9);
  __ptr = (double *)malloc(__size);
  pdVar5 = (double *)malloc(__size * lVar9);
  mtranspose(A,M,N,col);
  mmult(col,b,C,N,M,1);
  mmult(col,A,C_00,N,M,N);
  iVar4 = chol(C_00,N);
  if (iVar4 == -1) {
    iVar4 = -1;
  }
  else {
    mtranspose(C_00,N,N,pdVar5);
    *__ptr = *C / *pdVar5;
    uVar3 = (ulong)(uint)N;
    if (1 < N) {
      uVar6 = 1;
      pdVar7 = pdVar5;
      do {
        pdVar7 = pdVar7 + uVar3;
        dVar10 = 0.0;
        uVar8 = 0;
        do {
          dVar10 = dVar10 + __ptr[uVar8] * pdVar7[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
        __ptr[uVar6] = (C[uVar6] - dVar10) / pdVar5[uVar6 * uVar3 + uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar3);
    }
    x[lVar9 + -1] = __ptr[lVar9 + -1] / C_00[(ulong)(uint)(N * N) - 1];
    if (1 < N) {
      lVar9 = (long)(N + -2);
      pdVar7 = C_00 + lVar9 * (uVar3 + 1) + 1;
      pdVar5 = x + (N - 1);
      uVar6 = 1;
      do {
        dVar10 = 0.0;
        if (lVar9 < (long)(uVar3 - 1)) {
          uVar8 = 0;
          do {
            pdVar1 = pdVar7 + uVar8;
            pdVar2 = pdVar5 + uVar8;
            uVar8 = uVar8 + 1;
            dVar10 = dVar10 + *pdVar1 * *pdVar2;
          } while (uVar6 != uVar8);
        }
        x[lVar9] = (__ptr[lVar9] - dVar10) / C_00[lVar9 * (uVar3 + 1)];
        lVar9 = lVar9 + -1;
        uVar6 = uVar6 + 1;
        pdVar7 = (double *)((long)pdVar7 - (uVar3 * 8 + 8));
        pdVar5 = pdVar5 + -1;
      } while (uVar6 != uVar3);
    }
    free(col);
    free(C);
    free(C_00);
    free(__ptr);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int lls_normal(double *A,double *b,int M,int N,double *x) {
	int retcode,sc,i,j,c1,l;
	double sum;
	double *AT,*d,*C,*y,*CT;
	// M - data points
	// N - Number of parameters
	// A - MXN; b size - M vector; AT - NXM

	AT = (double*) malloc(sizeof(double) * M * N);
	d = (double*) malloc(sizeof(double) * N);
	C = (double*) malloc(sizeof(double) * N * N);
	y = (double*) malloc(sizeof(double) * N);
	CT = (double*) malloc(sizeof(double) * N * N);

	retcode = 0;

	mtranspose(A,M,N,AT);
	mmult(AT,b,d,N,M,1);
	mmult(AT,A,C,N,M,N);

	sc = chol(C,N);
	if (sc == -1) {
		return -1;
	}

	mtranspose(C,N,N,CT);
	//Forward Substitution

	y[0] = d[0]/CT[0];
	for(i = 1; i < N; ++i) {
		sum = 0.;
		c1 = i*N;
		for(j = 0; j < i; ++j) {
			sum += y[j] * CT[c1 + j];
		}
		y[i] = (d[i] - sum)/CT[c1+i];
	}

	//Back Substitution

	x[N - 1] = y[N - 1]/C[N * N - 1];

	for (i = N - 2; i >= 0; i--) {
		sum = 0.;
		c1 = i*(N+1);
		l=0;
		for(j = i+1; j < N;j++) {
			l++;
			sum += C[c1 + l] * x[j];
		}
		x[i] = (y[i] - sum) / C[c1];
	}

	free(AT);
	free(d);
	free(C);
	free(y);
	return retcode;
}